

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ticket.c
# Opt level: O2

int mbedtls_ssl_ticket_write
              (void *p_ticket,mbedtls_ssl_session *session,uchar *start,uchar *end,size_t *tlen,
              uint32_t *ticket_lifetime)

{
  uchar *input;
  uchar *__dest;
  int iVar1;
  long lVar2;
  ulong ilen;
  int iVar3;
  size_t local_60;
  size_t ciph_len;
  
  *tlen = 0;
  iVar1 = -0x7100;
  if ((((p_ticket != (void *)0x0) && (*(long *)((long)p_ticket + 200) != 0)) &&
      (iVar3 = -0x6a00, iVar1 = iVar3, 0x21 < (long)end - (long)start)) &&
     (iVar1 = ssl_ticket_update_keys((mbedtls_ssl_ticket_context *)p_ticket), iVar1 == 0)) {
    lVar2 = (ulong)*(byte *)((long)p_ticket + 0xc0) * 0x60;
    *ticket_lifetime = *(uint32_t *)((long)p_ticket + 0xc4);
    *(undefined4 *)start = *(undefined4 *)((long)p_ticket + lVar2);
    iVar1 = (**(code **)((long)p_ticket + 200))
                      (*(undefined8 *)((long)p_ticket + 0xd0),start + 4,0xc);
    if (iVar1 == 0) {
      input = start + 0x12;
      iVar1 = iVar3;
      if (0x97 < (ulong)((long)end - (long)input)) {
        memcpy(input,session,0x98);
        if (session->peer_cert == (mbedtls_x509_crt *)0x0) {
          local_60 = 0;
        }
        else {
          local_60 = (session->peer_cert->raw).len;
        }
        if (local_60 + 3 <= ((long)end - (long)input) - 0x98U) {
          start[0xaa] = (uchar)(local_60 >> 0x10);
          start[0xab] = (uchar)(local_60 >> 8);
          __dest = start + 0xad;
          start[0xac] = (uchar)local_60;
          if (session->peer_cert != (mbedtls_x509_crt *)0x0) {
            memcpy(__dest,(session->peer_cert->raw).p,local_60);
          }
          ilen = (long)(__dest + local_60) - (long)input;
          iVar1 = 0;
          if (ilen < 0x10000) {
            *(ushort *)(start + 0x10) = (ushort)ilen << 8 | (ushort)ilen >> 8;
            iVar1 = mbedtls_cipher_auth_encrypt
                              ((mbedtls_cipher_context_t *)((long)p_ticket + lVar2 + 8),start + 4,
                               0xc,start,0x12,input,ilen,input,&ciph_len,__dest + local_60,0x10);
            if ((iVar1 == 0) && (iVar1 = -0x6c00, ciph_len == ilen)) {
              *tlen = ilen + 0x22;
              iVar1 = 0;
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_ticket_write( void *p_ticket,
                              const mbedtls_ssl_session *session,
                              unsigned char *start,
                              const unsigned char *end,
                              size_t *tlen,
                              uint32_t *ticket_lifetime )
{
    int ret;
    mbedtls_ssl_ticket_context *ctx = p_ticket;
    mbedtls_ssl_ticket_key *key;
    unsigned char *key_name = start;
    unsigned char *iv = start + 4;
    unsigned char *state_len_bytes = iv + 12;
    unsigned char *state = state_len_bytes + 2;
    unsigned char *tag;
    size_t clear_len, ciph_len;

    *tlen = 0;

    if( ctx == NULL || ctx->f_rng == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    /* We need at least 4 bytes for key_name, 12 for IV, 2 for len 16 for tag,
     * in addition to session itself, that will be checked when writing it. */
    if( end - start < 4 + 12 + 2 + 16 )
        return( MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL );

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    if( ( ret = ssl_ticket_update_keys( ctx ) ) != 0 )
        goto cleanup;

    key = &ctx->keys[ctx->active];

    *ticket_lifetime = ctx->ticket_lifetime;

    memcpy( key_name, key->name, 4 );

    if( ( ret = ctx->f_rng( ctx->p_rng, iv, 12 ) ) != 0 )
        goto cleanup;

    /* Dump session state */
    if( ( ret = ssl_save_session( session,
                                  state, end - state, &clear_len ) ) != 0 ||
        (unsigned long) clear_len > 65535 )
    {
         goto cleanup;
    }
    state_len_bytes[0] = ( clear_len >> 8 ) & 0xff;
    state_len_bytes[1] = ( clear_len      ) & 0xff;

    /* Encrypt and authenticate */
    tag = state + clear_len;
    if( ( ret = mbedtls_cipher_auth_encrypt( &key->ctx,
                    iv, 12, key_name, 4 + 12 + 2,
                    state, clear_len, state, &ciph_len, tag, 16 ) ) != 0 )
    {
        goto cleanup;
    }
    if( ciph_len != clear_len )
    {
        ret = MBEDTLS_ERR_SSL_INTERNAL_ERROR;
        goto cleanup;
    }

    *tlen = 4 + 12 + 2 + 16 + ciph_len;

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}